

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Position.cpp
# Opt level: O0

Position * __thiscall iDynTree::Position::operator+(Position *this,Position *other)

{
  Position *in_RDI;
  
  compose(this,other);
  return in_RDI;
}

Assistant:

Position Position::operator+(const Position& other) const
    {
        return compose(*this,other);
    }